

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall
opts::BasicOption::BasicOption
          (BasicOption *this,char s_,string *l_,string *default_,string *type_,string *help_)

{
  this->_vptr_BasicOption = (_func_int **)&PTR__BasicOption_0014e0a8;
  this->s = s_;
  std::__cxx11::string::string((string *)&this->l,(string *)l_);
  std::__cxx11::string::string((string *)&this->d,(string *)default_);
  std::__cxx11::string::string((string *)&this->t,(string *)type_);
  std::__cxx11::string::string((string *)&this->help,(string *)help_);
  return;
}

Assistant:

BasicOption(char        s_,
                                std::string l_,
                                std::string default_,
                                std::string type_,
                                std::string help_):
                        s(s_), l(l_), d(default_), t(type_), help(help_)                    {}